

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::Printf<pbrt::PixelFormat>(char *fmt,PixelFormat *args)

{
  char *__s;
  string s;
  string local_30 [16];
  PixelFormat *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  StringPrintf<pbrt::PixelFormat>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  __s = (char *)std::__cxx11::string::c_str();
  fputs(__s,_stdout);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}